

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.c
# Opt level: O0

void sysbvm_backtrace_print(void)

{
  int addressCount;
  char **__ptr;
  int local_33c;
  int i;
  char **symbols;
  int backtraceSize;
  void *backtraceAddresses [100];
  
  addressCount = sysbvm_backtrace_obtain((void **)&stack0xfffffffffffffcd8,100);
  if (addressCount < 0) {
    fprintf(_stderr,"Failed to obtain a backtrace.");
  }
  else {
    __ptr = sysbvm_backtrace_symbols((void **)&stack0xfffffffffffffcd8,addressCount);
    for (local_33c = 0; local_33c < addressCount; local_33c = local_33c + 1) {
      printf("%s\n",__ptr[local_33c]);
    }
    free(__ptr);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_backtrace_print(void)
{    
    void *backtraceAddresses[SYSBVM_BACKTRACE_PRINT_MAX_SIZE];

    int backtraceSize = sysbvm_backtrace_obtain(backtraceAddresses, SYSBVM_BACKTRACE_PRINT_MAX_SIZE);
    if(backtraceSize < 0)
    {
        fprintf(stderr, "Failed to obtain a backtrace.");
        return;
    }

    char **symbols = sysbvm_backtrace_symbols(backtraceAddresses, backtraceSize);
    for(int i = 0; i < backtraceSize; ++i)
        printf("%s\n", symbols[i]);
    free(symbols);
}